

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.h
# Opt level: O3

void __thiscall
RayTracerTriangles::RayTracerTriangles(RayTracerTriangles *this,RayTracerConfig *config)

{
  vector<Triangle,_std::allocator<Triangle>_> *triangles;
  float *pfVar1;
  float fVar2;
  float fVar3;
  pointer pTVar4;
  int iVar5;
  ostream *poVar6;
  KdNode *pKVar7;
  Triangle *triangle;
  pointer __args;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auStack_38 [8];
  vector<float,_std::allocator<float>_> ranges;
  
  RayTracerBase::RayTracerBase(&this->super_RayTracerBase,config);
  iVar5 = std::thread::hardware_concurrency();
  this->threadNumber = iVar5;
  this->kdTree = (KdNode *)0x0;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," threads available\n",0x13);
  auStack_38 = (undefined1  [8])0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  triangles = &config->triangles;
  __args = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish != __args) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)auStack_38,(iterator)0x0,(float *)__args);
    __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_38,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(float *)__args);
      __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = (__args->x).x;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar1 = &(__args->x).y;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_38,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar1);
      __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar1;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar1 = &(__args->x).y;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_38,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar1);
      __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar1;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar1 = &(__args->x).z;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_38,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar1);
      __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar1;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar1 = &(__args->x).z;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_38,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar1);
      __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar1;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
  }
  pTVar4 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != pTVar4) {
    fVar10 = *(float *)((long)auStack_38 + 4);
    fVar16 = *(float *)((long)auStack_38 + 8);
    fVar9 = *(float *)((long)auStack_38 + 0xc);
    fVar8 = *(float *)((long)auStack_38 + 0x10);
    fVar14 = *(float *)auStack_38;
    fVar19 = *(float *)((long)auStack_38 + 0x14);
    do {
      fVar20 = (__args->y).x;
      fVar11 = (__args->z).x;
      fVar2 = (__args->x).x;
      fVar3 = (__args->x).y;
      fVar15 = fVar20;
      if (fVar2 <= fVar20) {
        fVar15 = fVar2;
      }
      fVar12 = fVar11;
      if (fVar15 <= fVar11) {
        fVar12 = fVar15;
      }
      if (fVar14 <= fVar12) {
        fVar12 = fVar14;
      }
      fVar14 = (__args->y).y;
      fVar15 = (__args->z).y;
      fVar21 = fVar14;
      if (fVar3 <= fVar14) {
        fVar21 = fVar3;
      }
      fVar18 = fVar15;
      if (fVar21 <= fVar15) {
        fVar18 = fVar21;
      }
      if (fVar16 <= fVar18) {
        fVar18 = fVar16;
      }
      fVar16 = fVar18;
      fVar21 = (__args->x).z;
      fVar18 = (__args->y).z;
      fVar17 = (__args->z).z;
      fVar22 = fVar18;
      if (fVar21 <= fVar18) {
        fVar22 = fVar21;
      }
      fVar13 = fVar17;
      if (fVar22 <= fVar17) {
        fVar13 = fVar22;
      }
      if (fVar8 <= fVar13) {
        fVar13 = fVar8;
      }
      fVar8 = fVar13;
      if (fVar20 <= fVar2) {
        fVar20 = fVar2;
      }
      if (fVar11 <= fVar20) {
        fVar11 = fVar20;
      }
      if (fVar11 <= fVar10) {
        fVar11 = fVar10;
      }
      fVar10 = fVar11;
      if (fVar14 <= fVar3) {
        fVar14 = fVar3;
      }
      if (fVar15 <= fVar14) {
        fVar15 = fVar14;
      }
      if (fVar15 <= fVar9) {
        fVar15 = fVar9;
      }
      fVar9 = fVar15;
      if (fVar18 <= fVar21) {
        fVar18 = fVar21;
      }
      if (fVar17 <= fVar18) {
        fVar17 = fVar18;
      }
      if (fVar17 <= fVar19) {
        fVar17 = fVar19;
      }
      *(float *)auStack_38 = fVar12;
      *(float *)((long)auStack_38 + 4) = fVar10;
      *(float *)((long)auStack_38 + 8) = fVar16;
      *(float *)((long)auStack_38 + 0xc) = fVar9;
      *(float *)((long)auStack_38 + 0x10) = fVar8;
      *(float *)((long)auStack_38 + 0x14) = fVar17;
      __args = __args + 1;
      fVar14 = fVar12;
      fVar19 = fVar17;
    } while (__args != pTVar4);
  }
  pKVar7 = KdNode::build(triangles,(vector<float,_std::allocator<float>_> *)auStack_38,0);
  this->kdTree = pKVar7;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"building complete",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  if (auStack_38 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_38,
                    (long)ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_38);
  }
  return;
}

Assistant:

RayTracerTriangles(RayTracerConfig const& config)
    : RayTracerBase(config)
    , threadNumber(std::thread::hardware_concurrency())
  {
    std::cerr << threadNumber << " threads available\n";
    std::vector<float> ranges;
    if(config.triangles.size() > 0)
    {
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.z);
      ranges.push_back(config.triangles[0].x.z);
    }
    for(auto const& triangle : config.triangles)
    {
      Point pMin = getMinPoint(triangle);
      Point pMax = getMaxPoint(triangle);

       ranges[0] = std::min(ranges[0], pMin.x); 
       ranges[1] = std::max(ranges[1], pMax.x); 
       ranges[2] = std::min(ranges[2], pMin.y); 
       ranges[3] = std::max(ranges[3], pMax.y); 
       ranges[4] = std::min(ranges[4], pMin.z); 
       ranges[5] = std::max(ranges[5], pMax.z); 
    }
    kdTree = KdNode::build(const_cast<RayTracerConfig&>(config).triangles, ranges, 0);
    std::cerr << "building complete" << std::endl;
  }